

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32_update_de_30
               (secp256k1_modinv32_signed30 *d,secp256k1_modinv32_signed30 *e,
               secp256k1_modinv32_trans2x2 *t,secp256k1_modinv32_modinfo *modinfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  uVar1 = t->u;
  uVar2 = t->v;
  uVar3 = t->q;
  uVar4 = t->r;
  uVar9 = d->v[8] >> 0x1f;
  uVar7 = e->v[8] >> 0x1f;
  iVar5 = (uVar7 & uVar2) + (uVar9 & uVar1);
  iVar8 = (uVar7 & uVar4) + (uVar9 & uVar3);
  lVar13 = (long)e->v[0] * (long)(int)uVar2 + (long)d->v[0] * (long)(int)uVar1;
  lVar12 = (long)e->v[0] * (long)(int)uVar4 + (long)d->v[0] * (long)(int)uVar3;
  lVar10 = (long)(modinfo->modulus).v[0];
  lVar6 = (long)(int)(iVar5 - ((int)lVar13 * modinfo->modulus_inv30 + iVar5 & 0x3fffffff));
  lVar14 = (long)(int)(iVar8 - ((int)lVar12 * modinfo->modulus_inv30 + iVar8 & 0x3fffffff));
  lVar12 = lVar10 * lVar14 + lVar12 >> 0x1e;
  lVar13 = lVar6 * lVar10 + lVar13 >> 0x1e;
  lVar10 = 0;
  do {
    lVar11 = (long)(modinfo->modulus).v[lVar10 + 1];
    lVar13 = lVar11 * lVar6 + (long)e->v[lVar10 + 1] * (long)(int)uVar2 +
             (long)d->v[lVar10 + 1] * (long)(int)uVar1 + lVar13;
    lVar12 = lVar11 * lVar14 + (long)e->v[lVar10 + 1] * (long)(int)uVar4 +
             (long)d->v[lVar10 + 1] * (long)(int)uVar3 + lVar12;
    d->v[lVar10] = (uint)lVar13 & 0x3fffffff;
    e->v[lVar10] = (uint)lVar12 & 0x3fffffff;
    lVar12 = lVar12 >> 0x1e;
    lVar13 = lVar13 >> 0x1e;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 8);
  d->v[8] = (int32_t)lVar13;
  e->v[8] = (int32_t)lVar12;
  return;
}

Assistant:

static void secp256k1_modinv32_update_de_30(secp256k1_modinv32_signed30 *d, secp256k1_modinv32_signed30 *e, const secp256k1_modinv32_trans2x2 *t, const secp256k1_modinv32_modinfo* modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t di, ei, md, me, sd, se;
    int64_t cd, ce;
    int i;
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(labs(u) <= (M30 + 1 - labs(v))); /* |u|+|v| <= 2^30 */
    VERIFY_CHECK(labs(q) <= (M30 + 1 - labs(r))); /* |q|+|r| <= 2^30 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d->v[8] >> 31;
    se = e->v[8] >> 31;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    di = d->v[0];
    ei = e->v[0];
    cd = (int64_t)u * di + (int64_t)v * ei;
    ce = (int64_t)q * di + (int64_t)r * ei;
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 30 zero bottom bits. */
    md -= (modinfo->modulus_inv30 * (uint32_t)cd + md) & M30;
    me -= (modinfo->modulus_inv30 * (uint32_t)ce + me) & M30;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    cd += (int64_t)modinfo->modulus.v[0] * md;
    ce += (int64_t)modinfo->modulus.v[0] * me;
    /* Verify that the low 30 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cd & M30) == 0); cd >>= 30;
    VERIFY_CHECK(((int32_t)ce & M30) == 0); ce >>= 30;
    /* Now iteratively compute limb i=1..8 of t*[d,e]+modulus*[md,me], and store them in output
     * limb i-1 (shifting down by 30 bits). */
    for (i = 1; i < 9; ++i) {
        di = d->v[i];
        ei = e->v[i];
        cd += (int64_t)u * di + (int64_t)v * ei;
        ce += (int64_t)q * di + (int64_t)r * ei;
        cd += (int64_t)modinfo->modulus.v[i] * md;
        ce += (int64_t)modinfo->modulus.v[i] * me;
        d->v[i - 1] = (int32_t)cd & M30; cd >>= 30;
        e->v[i - 1] = (int32_t)ce & M30; ce >>= 30;
    }
    /* What remains is limb 9 of t*[d,e]+modulus*[md,me]; store it as output limb 8. */
    d->v[8] = (int32_t)cd;
    e->v[8] = (int32_t)ce;

    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}